

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

string * anon_unknown.dwarf_eb88::codecvt_u16_to_u8(string *__return_storage_ptr__,u16string *u16)

{
  char16_t *__first;
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  local_70;
  
  local_70._M_cvt._M_t.
  super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  .
  super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
        )operator_new(0x20);
  *(undefined4 *)
   ((long)local_70._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_70._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x10) = 0x10ffff;
  *(undefined4 *)
   ((long)local_70._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined ***)
   local_70._M_cvt._M_t.
   super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   .
   super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
   ._M_head_impl = &PTR____codecvt_utf8_utf16_base_00111c58;
  local_70._M_byte_err_string._M_dataplus._M_p = (pointer)&local_70._M_byte_err_string.field_2;
  local_70._M_byte_err_string._M_string_length = 0;
  local_70._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_70._M_wide_err_string._M_dataplus._M_p = (pointer)&local_70._M_wide_err_string.field_2;
  local_70._M_wide_err_string._M_string_length = 0;
  local_70._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_70._M_state.__count = 0;
  local_70._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_70._M_count = 0;
  local_70._M_with_cvtstate = false;
  local_70._M_with_strings = false;
  __first = (u16->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&local_70,__first,__first + u16->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_70);
  return __return_storage_ptr__;
}

Assistant:

inline
string codecvt_u16_to_u8(const u16string& u16)
{
    using codecvt = std::codecvt_utf8_utf16<char16_t>;
    return std::wstring_convert<codecvt, char16_t>{}.to_bytes(u16);
}